

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O2

vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
* get_primes<libdivide::divider<unsigned_short,(libdivide::Branching)0>,unsigned_short>
            (vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
             *__return_storage_ptr__,unsigned_short max)

{
  ulong uVar1;
  int iVar2;
  short sVar3;
  short sVar4;
  size_t i;
  long lVar5;
  size_t j;
  ulong uVar6;
  int iVar7;
  undefined6 in_register_00000032;
  size_t i_1;
  ulong uVar8;
  divider<unsigned_short,_(libdivide::Branching)0> local_44;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> sieve;
  
  uVar8 = CONCAT62(in_register_00000032,max) & 0xffffffff;
  local_44.div.denom.magic = CONCAT11(local_44.div.denom.magic._1_1_,1);
  std::vector<char,_std::allocator<char>_>::vector
            (&sieve,uVar8 + 1,(value_type *)&local_44,&local_41);
  for (lVar5 = 2; uVar6 = lVar5 * lVar5, uVar6 < uVar8 || uVar6 - uVar8 == 0; lVar5 = lVar5 + 1) {
    if (sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar5] != '\0') {
      for (; uVar6 <= uVar8; uVar6 = uVar6 + lVar5) {
        sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] = '\0';
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar6 = 2; uVar6 <= uVar8; uVar6 = uVar6 + 1) {
    if (sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] != '\0') {
      iVar2 = (int)uVar6;
      local_44.div.denom.more = (byte)LZCOUNT((ushort)uVar6) ^ 0xf;
      if ((iVar2 - 1U & (uint)(uVar6 & 0xffff)) == 0) {
        local_44.div.denom.magic = 0;
      }
      else {
        uVar1 = (ulong)(uint)(0x10000 << local_44.div.denom.more) / (uVar6 & 0xffff);
        sVar4 = (short)uVar1;
        iVar7 = (int)uVar1 * iVar2;
        if ((iVar7 + iVar2 & 0xffffU) >> local_44.div.denom.more != 0) {
          sVar3 = (short)iVar7;
          local_44.div.denom.more = local_44.div.denom.more | 0x40;
          sVar4 = (ushort)(0 < sVar3 || (ushort)uVar6 <= (ushort)(sVar3 * -2)) + sVar4 * 2;
        }
        local_44.div.denom.magic = sVar4 + 1;
      }
      std::
      vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>
      ::emplace_back<libdivide::divider<unsigned_short,(libdivide::Branching)0>>
                ((vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>
                  *)__return_storage_ptr__,&local_44);
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&sieve.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}